

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O0

_Bool COSE_Recipient_SetKey_secret
                (HCOSE_RECIPIENT hRecipient,byte *rgbKey,int cbKey,byte *rgbKid,int cbKid,
                cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  cn_cbor *cnAlg;
  byte *pbKey;
  byte *pbTemp;
  cn_cbor_errback cbor_error;
  cn_cbor *cnTemp;
  cn_cbor *cn_Temp;
  COSE_RecipientInfo *p;
  cose_errback *perr_local;
  int cbKid_local;
  byte *rgbKid_local;
  int cbKey_local;
  byte *rgbKey_local;
  HCOSE_RECIPIENT hRecipient_local;
  
  cnTemp = (cn_cbor *)0x0;
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  pbKey = (byte *)0x0;
  cnAlg = (cn_cbor *)0x0;
  _Var1 = IsValidRecipientHandle(hRecipient);
  if (_Var1) {
    if (rgbKey == (byte *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      pcVar3 = _COSE_map_get_int((COSE *)hRecipient,1,7,perr);
      if (pcVar3 == (cn_cbor *)0x0) {
        cnTemp = cn_cbor_int_create(-6,(cn_cbor_errback *)&pbTemp);
        if (cnTemp == (cn_cbor *)0x0) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
            perr->err = cVar2;
          }
          goto LAB_0033984f;
        }
        _Var1 = COSE_Recipient_map_put_int(hRecipient,1,cnTemp,2,perr);
        if (!_Var1) goto LAB_0033984f;
      }
      else if ((pcVar3->type != CN_CBOR_INT) || ((pcVar3->v).bytes != (uint8_t *)0xfffffffffffffffa)
              ) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
        goto LAB_0033984f;
      }
      cnTemp = (cn_cbor *)0x0;
      if (0 < cbKid) {
        pbKey = (byte *)calloc((long)cbKid,1);
        if (pbKey == (uint8_t *)0x0) {
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_OUT_OF_MEMORY;
          }
          goto LAB_0033984f;
        }
        memcpy(pbKey,rgbKid,(long)cbKid);
        cbor_error = (cn_cbor_errback)cn_cbor_data_create(pbKey,cbKid,(cn_cbor_errback *)&pbTemp);
        if (cbor_error == (cn_cbor_errback)0x0) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
            perr->err = cVar2;
          }
          goto LAB_0033984f;
        }
        pbKey = (byte *)0x0;
        _Var1 = COSE_Recipient_map_put_int(hRecipient,4,(cn_cbor *)cbor_error,2,perr);
        if (!_Var1) goto LAB_0033984f;
      }
      pbKey = (byte *)0x0;
      cnAlg = (cn_cbor *)calloc((long)cbKey,1);
      if (cnAlg == (cn_cbor *)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
      }
      else {
        memcpy(cnAlg,rgbKey,(long)cbKey);
        cnTemp = cn_cbor_map_create((cn_cbor_errback *)&pbTemp);
        if (cnTemp == (cn_cbor *)0x0) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
            perr->err = cVar2;
          }
        }
        else {
          cbor_error = (cn_cbor_errback)cn_cbor_int_create(4,(cn_cbor_errback *)&pbTemp);
          if (cbor_error == (cn_cbor_errback)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
              perr->err = cVar2;
            }
          }
          else {
            _Var1 = cn_cbor_mapput_int(cnTemp,1,(cn_cbor *)cbor_error,(cn_cbor_errback *)&pbTemp);
            if (_Var1) {
              cbor_error.pos = 0;
              cbor_error.err = CN_CBOR_NO_ERROR;
              cbor_error = (cn_cbor_errback)
                           cn_cbor_data_create((uint8_t *)cnAlg,cbKey,(cn_cbor_errback *)&pbTemp);
              if (cbor_error == (cn_cbor_errback)0x0) {
                if (perr != (cose_errback *)0x0) {
                  cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
                  perr->err = cVar2;
                }
              }
              else {
                cnAlg = (cn_cbor *)0x0;
                _Var1 = cn_cbor_mapput_int(cnTemp,-1,(cn_cbor *)cbor_error,
                                           (cn_cbor_errback *)&pbTemp);
                if (_Var1) {
                  cbor_error.pos = 0;
                  cbor_error.err = CN_CBOR_NO_ERROR;
                  _Var1 = COSE_Recipient_SetKey(hRecipient,cnTemp,perr);
                  if (_Var1) {
                    return true;
                  }
                }
                else if (perr != (cose_errback *)0x0) {
                  cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
                  perr->err = cVar2;
                }
              }
            }
            else if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR((cn_cbor_errback)pbTemp);
              perr->err = cVar2;
            }
          }
        }
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
LAB_0033984f:
  if (cnTemp != (cn_cbor *)0x0) {
    cn_cbor_free(cnTemp);
  }
  if (cbor_error != (cn_cbor_errback)0x0) {
    cn_cbor_free((cn_cbor *)cbor_error);
  }
  if (pbKey != (byte *)0x0) {
    free(pbKey);
  }
  if (cnAlg != (cn_cbor *)0x0) {
    free(cnAlg);
  }
  return false;
}

Assistant:

bool COSE_Recipient_SetKey_secret(HCOSE_RECIPIENT hRecipient, const byte * rgbKey, int cbKey, const byte * rgbKid, int cbKid, cose_errback * perr)
{
	COSE_RecipientInfo * p;
	cn_cbor * cn_Temp = NULL;
	cn_cbor * cnTemp = NULL;
	cn_cbor_errback cbor_error;
	byte * pbTemp = NULL;
	byte * pbKey = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif

	CHECK_CONDITION(IsValidRecipientHandle(hRecipient), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgbKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)hRecipient;

#ifdef USE_CBOR_CONTEXT
	context = &p->m_encrypt.m_message.m_allocContext;
#endif

	cn_cbor * cnAlg = _COSE_map_get_int(&p->m_encrypt.m_message, COSE_Header_Algorithm, COSE_BOTH, perr);
	if (cnAlg != NULL) {
		CHECK_CONDITION(cnAlg->type == CN_CBOR_INT && cnAlg->v.sint == COSE_Algorithm_Direct, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		cn_Temp = cn_cbor_int_create(COSE_Algorithm_Direct, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);
		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_Algorithm, cn_Temp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cn_Temp = NULL;
	}

	if (cbKid > 0) {
		pbTemp = (byte *)COSE_CALLOC(cbKid, 1, context);
		CHECK_CONDITION(pbTemp != NULL, COSE_ERR_OUT_OF_MEMORY);

		memcpy(pbTemp, rgbKid, cbKid);
		cnTemp = cn_cbor_data_create(pbTemp, cbKid, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
		pbTemp = NULL;

		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_KID, cnTemp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
	}

	pbKey = (byte *)COSE_CALLOC(cbKey, 1, context);
	CHECK_CONDITION(pbKey != NULL, COSE_ERR_OUT_OF_MEMORY);

	memcpy(pbKey, rgbKey, cbKey);

	cn_Temp = cn_cbor_map_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);

	cnTemp = cn_cbor_int_create(4, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, COSE_Key_Type, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	cnTemp = cn_cbor_data_create(pbKey, cbKey, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	pbKey = NULL;
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, -1, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	if (!COSE_Recipient_SetKey(hRecipient, cn_Temp, perr)) goto errorReturn;
	cn_Temp = NULL;

	return true;

errorReturn:
	if (cn_Temp != NULL) CN_CBOR_FREE(cn_Temp, context);
	if (cnTemp != NULL) CN_CBOR_FREE(cnTemp, context);
	if (pbTemp != NULL) COSE_FREE(pbTemp, context);
	if (pbKey != NULL) COSE_FREE(pbKey, context);
	return false;
}